

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

MIR_reg_t scan_var_to_var(gen_ctx_t gen_ctx,int scan_var)

{
  gen_ctx_t bm;
  VARR_live_range_t *pVVar1;
  bitmap_t pVVar2;
  void **ppvVar3;
  live_range_t_conflict plVar4;
  live_range_t_conflict plVar5;
  MIR_item_t pMVar6;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint start;
  uint uVar7;
  ulong uVar8;
  size_t nb;
  gen_ctx_t gen_ctx_00;
  int in_R8D;
  ulong uVar9;
  
  uVar8 = (ulong)(uint)scan_var;
  if (*(int *)((long)&gen_ctx->ctx + 4) == 0) {
    return scan_var;
  }
  if (scan_var < 0) {
LAB_0016da80:
    __assert_fail("scan_var >= 0 && (int) (VARR_MIR_reg_tlength (gen_ctx->lr_ctx->scan_var_to_var_map)) > scan_var"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x171b,"MIR_reg_t scan_var_to_var(gen_ctx_t, int)");
  }
  pMVar6 = gen_ctx->curr_func_item;
  if (pMVar6 == (MIR_item_t)0x0) {
    scan_var_to_var_cold_2();
  }
  else {
    ppvVar3 = &pMVar6->data;
    if ((int)*ppvVar3 <= scan_var) goto LAB_0016da80;
    pMVar6 = (pMVar6->item_link).prev;
    if ((pMVar6 != (MIR_item_t)0x0) && ((void *)(ulong)(uint)scan_var < *ppvVar3)) {
      return *(MIR_reg_t *)((long)&pMVar6->data + (long)(ulong)(uint)scan_var * 4);
    }
  }
  scan_var_to_var_cold_1();
  uVar7 = (uint)uVar8;
  start = (uint)pMVar6;
  uVar9 = uVar8 & 0xffffffff;
  gen_ctx_00 = gen_ctx;
  if ((in_R8D != 0) && (gen_ctx->lr_ctx->scan_vars_num == 0)) {
    bm = (gen_ctx_t)gen_ctx->lr_ctx->referenced_vars;
    nb = uVar9 + 1;
    gen_ctx_00 = bm;
    bitmap_expand((bitmap_t)bm,nb);
    uVar7 = (uint)nb;
    if (bm == (gen_ctx_t)0x0) goto LAB_0016db94;
    pMVar6 = (MIR_item_t)(uVar9 >> 6);
    ppvVar3 = &bm->curr_func_item->data + (long)pMVar6;
    *ppvVar3 = (void *)((ulong)*ppvVar3 | 1L << (uVar8 & 0x3f));
  }
  pVVar1 = gen_ctx->lr_ctx->var_live_ranges;
  if (((pVVar1 == (VARR_live_range_t *)0x0) ||
      (pMVar6 = (MIR_item_t)pVVar1->varr, pMVar6 == (MIR_item_t)0x0)) || (pVVar1->els_num <= uVar9))
  {
    make_var_dead_cold_4();
LAB_0016db8a:
    make_var_dead_cold_2();
  }
  else {
    pVVar2 = gen_ctx->lr_ctx->live_vars;
    if (pVVar2 != (bitmap_t)0x0) {
      plVar5 = (live_range_t_conflict)(&pMVar6->data)[uVar9];
      plVar4 = (live_range_t_conflict)(long)extraout_EDX;
      if ((plVar4 < (live_range_t_conflict)(pVVar2->els_num << 6)) &&
         (uVar8 = pVVar2->varr[(ulong)plVar4 >> 6],
         pVVar2->varr[(ulong)plVar4 >> 6] = uVar8 & ~(1L << ((ulong)plVar4 & 0x3f)),
         (uVar8 >> ((ulong)plVar4 & 0x3f) & 1) != 0)) {
        plVar5->finish = start;
LAB_0016db7c:
        return (MIR_reg_t)plVar4;
      }
      uVar7 = start;
      plVar4 = create_live_range(gen_ctx,start,start,plVar5);
      pMVar6 = (MIR_item_t)pVVar1->varr;
      gen_ctx_00 = gen_ctx;
      if ((pMVar6 != (MIR_item_t)0x0) && (uVar9 < pVVar1->els_num)) {
        (&pMVar6->data)[uVar9] = plVar4;
        goto LAB_0016db7c;
      }
      goto LAB_0016db8a;
    }
  }
  make_var_dead_cold_3();
LAB_0016db94:
  make_var_dead_cold_1();
  plVar5 = gen_ctx_00->lr_ctx->free_lr_list;
  if (plVar5 == (live_range_t_conflict)0x0) {
    plVar5 = (live_range_t_conflict)gen_malloc(gen_ctx_00,0x20);
  }
  else {
    gen_ctx_00->lr_ctx->free_lr_list = plVar5->next;
  }
  if ((int)uVar7 < 0) {
    __assert_fail("start >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x186d,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
  }
  if (extraout_EDX_00 < uVar7) {
    __assert_fail("finish < 0 || start <= finish",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x186e,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
  }
  plVar5->start = uVar7;
  plVar5->finish = extraout_EDX_00;
  plVar5->ref_cost = 1;
  plVar5->next = (live_range_t)pMVar6;
  plVar5->lr_bb = (lr_bb_t_conflict)0x0;
  return (MIR_reg_t)plVar5;
}

Assistant:

static MIR_reg_t scan_var_to_var (gen_ctx_t gen_ctx, int scan_var) {
  if (scan_vars_num == 0) return (MIR_reg_t) scan_var;
  gen_assert (scan_var >= 0 && (int) VARR_LENGTH (MIR_reg_t, scan_var_to_var_map) > scan_var);
  return VARR_GET (MIR_reg_t, scan_var_to_var_map, scan_var);
}